

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int get_intersection(string *s1,string *s2)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  pointer pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = s1->_M_string_length;
  lVar4 = std::__cxx11::string::find((string *)s2,(ulong)s1);
  if (lVar4 == -1) {
    pcVar5 = (s1->_M_dataplus)._M_p;
    iVar3 = 0;
    lVar4 = 0;
    uVar6 = 0;
    while( true ) {
      uVar7 = uVar6;
      if (uVar6 < uVar9) {
        uVar7 = uVar9;
      }
      if (uVar9 == uVar6) break;
      lVar8 = 0;
      do {
        if (uVar7 + lVar4 == lVar8) {
          uVar9 = (ulong)(uint)((int)uVar9 - (int)uVar6);
          goto LAB_00103375;
        }
        pcVar1 = pcVar5 + lVar8;
        pcVar2 = (s2->_M_dataplus)._M_p + lVar8;
        lVar8 = lVar8 + 1;
      } while (*pcVar1 == *pcVar2);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + -1;
      pcVar5 = pcVar5 + 1;
    }
  }
  else {
LAB_00103375:
    iVar3 = (int)uVar9;
  }
  return iVar3;
}

Assistant:

int get_intersection(const std::string& s1, const std::string& s2)
{
    size_t l = s1.length();
    if (std::string::npos != s2.find(s1))
    {
        return l;
    }
    for (size_t i = 0; i < l; i++)
    {
        bool result = true;
        for (size_t j = i; j < l; j++)
        {
            if (s1[j] != s2[j - i])
            {
                result = false;
                break;
            }
        }
        if (result)
        {
            return l - i;
        }
    }
    return 0;
}